

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O1

void Gia_ManNormalizeEquivalences(Gia_Man_t *p,int *pReprs)

{
  int iVar1;
  uint uVar2;
  Gia_Rpr_t *pGVar3;
  long lVar4;
  int *piVar5;
  
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                  ,0x109,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
  }
  if (p->pNexts == (int *)0x0) {
    iVar1 = p->nObjs;
    pGVar3 = (Gia_Rpr_t *)calloc((long)iVar1,4);
    p->pReprs = pGVar3;
    if (0 < (long)iVar1) {
      lVar4 = 0;
      do {
        p->pReprs[lVar4] = (Gia_Rpr_t)((uint)p->pReprs[lVar4] | 0xfffffff);
        lVar4 = lVar4 + 1;
      } while (lVar4 < p->nObjs);
    }
    if (0 < p->nObjs) {
      lVar4 = 0;
      do {
        if (pReprs[lVar4] != -1) {
          uVar2 = Gia_ManFindRepr_rec(pReprs,(int)lVar4);
          if (lVar4 <= (int)uVar2 && uVar2 != 0xfffffff) {
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          p->pReprs[lVar4] = (Gia_Rpr_t)((uint)p->pReprs[lVar4] & 0xf0000000 | uVar2 & 0xfffffff);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < p->nObjs);
    }
    piVar5 = Gia_ManDeriveNexts(p);
    p->pNexts = piVar5;
    return;
  }
  __assert_fail("p->pNexts == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                ,0x10a,"void Gia_ManNormalizeEquivalences(Gia_Man_t *, int *)");
}

Assistant:

void Gia_ManNormalizeEquivalences( Gia_Man_t * p, int * pReprs )
{
    int i, iRepr;
    assert( p->pReprs == NULL );
    assert( p->pNexts == NULL );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( pReprs[i] == ~0 )
            continue;
        iRepr = Gia_ManFindRepr_rec( pReprs, i );
        Gia_ObjSetRepr( p, i, iRepr );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
}